

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O1

int __thiscall ncnn::Crop::load_param(Crop *this,ParamDict *pd)

{
  Mat *pMVar1;
  pointer pcVar2;
  pointer pcVar3;
  int *piVar4;
  void *pvVar5;
  Allocator *pAVar6;
  size_type sVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 extraout_EDX_01;
  undefined4 uVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 local_d8 [32];
  Allocator *local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  int local_a0;
  size_t local_98;
  undefined1 local_88 [32];
  Allocator *local_68;
  int iStack_60;
  int iStack_5c;
  int iStack_58;
  int iStack_54;
  int local_50;
  size_t local_48;
  string *local_40;
  Mat *local_38;
  
  iVar8 = ParamDict::get(pd,0,0);
  this->woffset = iVar8;
  iVar8 = ParamDict::get(pd,1,0);
  this->hoffset = iVar8;
  iVar8 = ParamDict::get(pd,0xd,0);
  this->doffset = iVar8;
  iVar8 = ParamDict::get(pd,2,0);
  this->coffset = iVar8;
  iVar8 = ParamDict::get(pd,3,0);
  this->outw = iVar8;
  iVar8 = ParamDict::get(pd,4,0);
  this->outh = iVar8;
  iVar8 = ParamDict::get(pd,0xe,0);
  this->outd = iVar8;
  iVar8 = ParamDict::get(pd,5,0);
  this->outc = iVar8;
  iVar8 = ParamDict::get(pd,6,0);
  this->woffset2 = iVar8;
  iVar8 = ParamDict::get(pd,7,0);
  this->hoffset2 = iVar8;
  iVar8 = ParamDict::get(pd,0xf,0);
  this->doffset2 = iVar8;
  iVar8 = ParamDict::get(pd,8,0);
  this->coffset2 = iVar8;
  local_48 = 0;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._16_4_ = 0;
  local_88._20_4_ = 0;
  local_88._24_4_ = 0;
  local_68 = (Allocator *)0x0;
  iStack_60 = 0;
  iStack_5c = 0;
  iStack_58 = 0;
  iStack_54 = 0;
  local_50 = 0;
  ParamDict::get((Mat *)local_d8,pd,9,(Mat *)local_88);
  pMVar1 = &this->starts;
  if (pMVar1 != (Mat *)local_d8) {
    piVar4 = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->starts).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar5 = (this->starts).data;
        pAVar6 = (this->starts).allocator;
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
          }
        }
        else {
          (*pAVar6->_vptr_Allocator[3])();
        }
      }
    }
    (this->starts).cstep = 0;
    *(undefined8 *)((long)&(this->starts).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->starts).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->starts).refcount = (int *)0x0;
    (this->starts).dims = 0;
    (this->starts).w = 0;
    (this->starts).h = 0;
    (this->starts).d = 0;
    (this->starts).c = 0;
    (this->starts).data = (void *)local_d8._0_8_;
    (this->starts).refcount = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
    (this->starts).elemsize = CONCAT44(local_d8._20_4_,local_d8._16_4_);
    (this->starts).elempack = local_d8._24_4_;
    (this->starts).allocator = local_b8;
    (this->starts).dims = (int)local_b0;
    (this->starts).w = local_b0._4_4_;
    (this->starts).h = (int)uStack_a8;
    (this->starts).d = uStack_a8._4_4_;
    (this->starts).c = local_a0;
    (this->starts).cstep = local_98;
  }
  piVar4 = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_b8 == (Allocator *)0x0) {
        if ((pointer)local_d8._0_8_ != (pointer)0x0) {
          free((void *)local_d8._0_8_);
        }
      }
      else {
        (*local_b8->_vptr_Allocator[3])();
      }
    }
  }
  local_98 = 0;
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_4_ = 0;
  local_d8._12_4_ = 0;
  local_d8._16_4_ = 0;
  local_d8._20_4_ = 0;
  local_d8._24_4_ = 0;
  local_b0._0_4_ = 0;
  local_b0._4_4_ = 0;
  uStack_a8._0_4_ = 0;
  uStack_a8._4_4_ = 0;
  local_a0 = 0;
  piVar4 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_68 == (Allocator *)0x0) {
        if ((pointer)local_88._0_8_ != (pointer)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (*local_68->_vptr_Allocator[3])();
      }
    }
  }
  local_48 = 0;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._16_4_ = 0;
  local_88._20_4_ = 0;
  local_88._24_4_ = 0;
  local_68 = (Allocator *)0x0;
  iStack_60 = 0;
  iStack_5c = 0;
  iStack_58 = 0;
  iStack_54 = 0;
  local_50 = 0;
  ParamDict::get((Mat *)local_d8,pd,10,(Mat *)local_88);
  if (&this->ends != (Mat *)local_d8) {
    piVar4 = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->ends).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar5 = (this->ends).data;
        pAVar6 = (this->ends).allocator;
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
          }
        }
        else {
          (*pAVar6->_vptr_Allocator[3])();
        }
      }
    }
    (this->ends).cstep = 0;
    *(undefined8 *)((long)&(this->ends).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->ends).elemsize + 4) = 0;
    (this->ends).data = (void *)0x0;
    (this->ends).refcount = (int *)0x0;
    (this->ends).dims = 0;
    (this->ends).w = 0;
    (this->ends).h = 0;
    (this->ends).d = 0;
    (this->ends).c = 0;
    (this->ends).data = (void *)local_d8._0_8_;
    (this->ends).refcount = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
    (this->ends).elemsize = CONCAT44(local_d8._20_4_,local_d8._16_4_);
    (this->ends).elempack = local_d8._24_4_;
    (this->ends).allocator = local_b8;
    (this->ends).dims = (int)local_b0;
    (this->ends).w = local_b0._4_4_;
    (this->ends).h = (int)uStack_a8;
    (this->ends).d = uStack_a8._4_4_;
    (this->ends).c = local_a0;
    (this->ends).cstep = local_98;
  }
  piVar4 = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_b8 == (Allocator *)0x0) {
        if ((pointer)local_d8._0_8_ != (pointer)0x0) {
          free((void *)local_d8._0_8_);
        }
      }
      else {
        (*local_b8->_vptr_Allocator[3])();
      }
    }
  }
  local_98 = 0;
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_4_ = 0;
  local_d8._12_4_ = 0;
  local_d8._16_4_ = 0;
  local_d8._20_4_ = 0;
  local_d8._24_4_ = 0;
  local_b0._0_4_ = 0;
  local_b0._4_4_ = 0;
  uStack_a8._0_4_ = 0;
  uStack_a8._4_4_ = 0;
  local_a0 = 0;
  piVar4 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_68 == (Allocator *)0x0) {
        if ((pointer)local_88._0_8_ != (pointer)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (*local_68->_vptr_Allocator[3])();
      }
    }
  }
  local_48 = 0;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._16_4_ = 0;
  local_88._20_4_ = 0;
  local_88._24_4_ = 0;
  local_68 = (Allocator *)0x0;
  iStack_60 = 0;
  iStack_5c = 0;
  iStack_58 = 0;
  iStack_54 = 0;
  local_50 = 0;
  ParamDict::get((Mat *)local_d8,pd,0xb,(Mat *)local_88);
  if (&this->axes != (Mat *)local_d8) {
    piVar4 = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    piVar4 = (this->axes).refcount;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        pvVar5 = (this->axes).data;
        pAVar6 = (this->axes).allocator;
        if (pAVar6 == (Allocator *)0x0) {
          if (pvVar5 != (void *)0x0) {
            free(pvVar5);
          }
        }
        else {
          (*pAVar6->_vptr_Allocator[3])();
        }
      }
    }
    (this->axes).cstep = 0;
    *(undefined8 *)((long)&(this->axes).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->axes).elemsize + 4) = 0;
    (this->axes).data = (void *)0x0;
    (this->axes).refcount = (int *)0x0;
    (this->axes).dims = 0;
    (this->axes).w = 0;
    (this->axes).h = 0;
    (this->axes).d = 0;
    (this->axes).c = 0;
    (this->axes).data = (void *)local_d8._0_8_;
    (this->axes).refcount = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
    (this->axes).elemsize = CONCAT44(local_d8._20_4_,local_d8._16_4_);
    (this->axes).elempack = local_d8._24_4_;
    (this->axes).allocator = local_b8;
    (this->axes).dims = (int)local_b0;
    (this->axes).w = local_b0._4_4_;
    (this->axes).h = (int)uStack_a8;
    (this->axes).d = uStack_a8._4_4_;
    (this->axes).c = local_a0;
    (this->axes).cstep = local_98;
  }
  piVar4 = (int *)CONCAT44(local_d8._12_4_,local_d8._8_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_b8 == (Allocator *)0x0) {
        if ((pointer)local_d8._0_8_ != (pointer)0x0) {
          free((void *)local_d8._0_8_);
        }
      }
      else {
        (*local_b8->_vptr_Allocator[3])();
      }
    }
  }
  local_98 = 0;
  local_d8._0_8_ = (pointer)0x0;
  local_d8._8_4_ = 0;
  local_d8._12_4_ = 0;
  local_d8._16_4_ = 0;
  local_d8._20_4_ = 0;
  local_d8._24_4_ = 0;
  local_b0._0_4_ = 0;
  local_b0._4_4_ = 0;
  uStack_a8._0_4_ = 0;
  uStack_a8._4_4_ = 0;
  local_a0 = 0;
  piVar4 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_68 == (Allocator *)0x0) {
        if ((pointer)local_88._0_8_ != (pointer)0x0) {
          free((void *)local_88._0_8_);
        }
      }
      else {
        (*local_68->_vptr_Allocator[3])();
      }
    }
  }
  pcVar2 = local_88 + 0x10;
  local_48 = 0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._16_4_ = 0;
  local_88._20_4_ = 0;
  local_88._24_4_ = 0;
  iStack_60 = 0;
  iStack_5c = 0;
  iStack_58 = 0;
  iStack_54 = 0;
  local_50 = 0;
  local_88._0_8_ = pcVar2;
  local_38 = pMVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
  ParamDict::get((string *)local_d8,pd,0x13,(string *)local_88);
  local_40 = &this->starts_expr;
  std::__cxx11::string::operator=((string *)local_40,(string *)local_d8);
  pcVar3 = local_d8 + 0x10;
  if ((pointer)local_d8._0_8_ != pcVar3) {
    operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
  }
  if ((pointer)local_88._0_8_ != pcVar2) {
    operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
  }
  local_88._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
  ParamDict::get((string *)local_d8,pd,0x14,(string *)local_88);
  std::__cxx11::string::operator=((string *)&this->ends_expr,(string *)local_d8);
  if ((pointer)local_d8._0_8_ != pcVar3) {
    operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
  }
  if ((pointer)local_88._0_8_ != pcVar2) {
    operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
  }
  local_88._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
  ParamDict::get((string *)local_d8,pd,0x15,(string *)local_88);
  std::__cxx11::string::operator=((string *)&this->axes_expr,(string *)local_d8);
  uVar11 = extraout_EDX;
  if ((pointer)local_d8._0_8_ != pcVar3) {
    operator_delete((void *)local_d8._0_8_,CONCAT44(local_d8._20_4_,local_d8._16_4_) + 1);
    uVar11 = extraout_EDX_00;
  }
  if ((pointer)local_88._0_8_ != pcVar2) {
    operator_delete((void *)local_88._0_8_,CONCAT44(local_88._20_4_,local_88._16_4_) + 1);
    uVar11 = extraout_EDX_01;
  }
  if (local_38->data == (void *)0x0) {
    bVar12 = false;
  }
  else {
    bVar12 = false;
    if (((long)(this->starts).c * (this->starts).cstep != 0) && ((this->ends).data != (void *)0x0))
    {
      bVar12 = (long)(this->ends).c * (this->ends).cstep != 0;
    }
  }
  sVar7 = (this->starts_expr)._M_string_length;
  auVar13._0_4_ = -(uint)(this->woffset2 == 0 && this->outw == 0);
  auVar13._4_4_ = -(uint)(this->hoffset2 == 0 && this->outh == 0);
  auVar13._8_4_ = -(uint)(this->doffset2 == 0 && this->outd == 0);
  auVar13._12_4_ = -(uint)(this->coffset2 == 0 && this->outc == 0);
  iVar8 = movmskps(uVar11,auVar13);
  if ((iVar8 == 0xf) && (!(bool)(((this->ends_expr)._M_string_length != 0 && sVar7 != 0) | bVar12)))
  {
    (this->super_Layer).one_blob_only = false;
  }
  if (((sVar7 != 0) || ((this->ends_expr)._M_string_length != 0)) ||
     ((this->axes_expr)._M_string_length != 0)) {
    iVar8 = count_expression_blobs(local_40);
    iVar9 = count_expression_blobs(&this->ends_expr);
    iVar10 = count_expression_blobs(&this->axes_expr);
    if (((1 < iVar8) || (1 < iVar9)) || (1 < iVar10)) {
      (this->super_Layer).one_blob_only = false;
    }
  }
  return 0;
}

Assistant:

int Crop::load_param(const ParamDict& pd)
{
    woffset = pd.get(0, 0);
    hoffset = pd.get(1, 0);
    doffset = pd.get(13, 0);
    coffset = pd.get(2, 0);
    outw = pd.get(3, 0);
    outh = pd.get(4, 0);
    outd = pd.get(14, 0);
    outc = pd.get(5, 0);
    woffset2 = pd.get(6, 0);
    hoffset2 = pd.get(7, 0);
    doffset2 = pd.get(15, 0);
    coffset2 = pd.get(8, 0);

    starts = pd.get(9, Mat());
    ends = pd.get(10, Mat());
    axes = pd.get(11, Mat());

    starts_expr = pd.get(19, "");
    ends_expr = pd.get(20, "");
    axes_expr = pd.get(21, "");

    // NCNN_LOGE("%s %s %s", starts_expr.c_str(), ends_expr.c_str(), axes_expr.c_str());

    bool numpy_style_slice = !starts.empty() && !ends.empty();

    if (!starts_expr.empty() && !ends_expr.empty())
        numpy_style_slice = true;

    if (outw == 0 && outh == 0 && outd == 0 && outc == 0 && woffset2 == 0 && hoffset2 == 0 && doffset2 == 0 && coffset2 == 0 && !numpy_style_slice)
    {
        one_blob_only = false;
    }

    // count reference blobs
    if (!starts_expr.empty() || !ends_expr.empty() || !axes_expr.empty())
    {
        const int starts_blob_count = count_expression_blobs(starts_expr);
        const int ends_blob_count = count_expression_blobs(ends_expr);
        const int axes_blob_count = count_expression_blobs(axes_expr);

        // NCNN_LOGE("%d %d %d", starts_blob_count, ends_blob_count, axes_blob_count);
        if (starts_blob_count > 1 || ends_blob_count > 1 || axes_blob_count > 1)
            one_blob_only = false;
    }

    return 0;
}